

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3b55d::DFDVkFormatListTest_ReconstructDFDBytesPlanes_Test::TestBody
          (DFDVkFormatListTest_ReconstructDFDBytesPlanes_Test *this)

{
  void *pvVar1;
  long lVar2;
  Message *message;
  undefined4 uVar3;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  long lVar6;
  AssertHelper local_90;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  uint32_t origBytesPlane47;
  uint32_t origBytesPlane03;
  long local_48;
  uint *local_40;
  char *local_38;
  
  for (lVar6 = 0; lVar6 != 0x3fc; lVar6 = lVar6 + 4) {
    uVar3 = *(undefined4 *)((long)DFDVkFormatListTest::formats + lVar6);
    pvVar1 = (void *)vk2dfd(uVar3);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = pvVar1 != (void *)0x0;
    if (pvVar1 == (void *)0x0) {
      testing::Message::Message((Message *)&local_90);
      std::operator<<((ostream *)(CONCAT44(local_90.data_._4_4_,(uint)local_90.data_) + 0x10),
                      "vk2dfd failed to produce DFD for ");
      local_38 = (char *)vkFormatString(uVar3);
      message = testing::Message::operator<<((Message *)&local_90,&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"dfd != __null",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
                 ,0x2bd,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_58,message);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((long *)CONCAT44(local_90.data_._4_4_,(uint)local_90.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(uint)local_90.data_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      return;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    origBytesPlane03 = *(uint32_t *)((long)pvVar1 + 0x14);
    origBytesPlane47 = *(uint32_t *)((long)pvVar1 + 0x18);
    *(undefined4 *)((long)pvVar1 + 0x14) = 0;
    reconstructDFDBytesPlanesFromSamples(pvVar1);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"origBytesPlane03","bdb[KHR_DF_WORD_BYTESPLANE0]",
               &origBytesPlane03,(uint *)((long)pvVar1 + 0x14));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
                 ,0x2c6,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"origBytesPlane47","bdb[KHR_DF_WORD_BYTESPLANE4]",
               &origBytesPlane47,(uint *)((long)pvVar1 + 0x18));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
                 ,0x2c7,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    free(pvVar1);
  }
  lVar6 = 1;
  lVar4 = 0x10;
  do {
    if (lVar6 == 3) {
      return;
    }
    pvVar1 = operator_new__(lVar6 * 0x40 + 0x70);
    *(undefined4 *)((long)pvVar1 + 4) = 0;
    *(int *)((long)pvVar1 + 8) = (int)lVar6 * 0x100000 + 0x180002;
    *(undefined8 *)((long)pvVar1 + 0xc) = 0x303000201a3;
    *(undefined8 *)((long)pvVar1 + 0x14) = 0;
    local_40 = (uint *)((long)pvVar1 + 0x18);
    for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 0x10) {
      *(undefined8 *)((long)pvVar1 + lVar2 + 0x20) = 0;
      uVar3 = 0xf3f0040;
      if (lVar2 == 0) {
        uVar3 = 0x3f0000;
      }
      *(undefined4 *)((long)pvVar1 + lVar2 + 0x1c) = uVar3;
      *(undefined4 *)((long)pvVar1 + lVar2 + 0x28) = 0xffffffff;
    }
    local_48 = lVar6;
    reconstructDFDBytesPlanesFromSamples(pvVar1);
    gtest_ar_.success_ = true;
    gtest_ar_._1_3_ = 0;
    local_90.data_._0_4_ = (uint)*(byte *)((long)pvVar1 + 0x14);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"8U",
               "(((bdb)[KHR_DF_WORD_BYTESPLANE0] >> (KHR_DF_SHIFT_BYTESPLANE0)) & (KHR_DF_MASK_BYTESPLANE0))"
               ,(uint *)&gtest_ar_,(uint *)&local_90);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
                 ,0x2fb,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    if (local_48 == 2) {
      gtest_ar_.success_ = true;
      gtest_ar_._1_3_ = 0;
      local_90.data_._0_4_ = (uint)*(byte *)((long)pvVar1 + 0x15);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"8U",
                 "(((bdb)[KHR_DF_WORD_BYTESPLANE1] >> (KHR_DF_SHIFT_BYTESPLANE1)) & (KHR_DF_MASK_BYTESPLANE1))"
                 ,(uint *)&gtest_ar_,(uint *)&local_90);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar5 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar5 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
                   ,0x2fd,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
LAB_00122b77:
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
        }
      }
    }
    else {
      gtest_ar_.success_ = false;
      gtest_ar_._1_3_ = 0;
      local_90.data_._0_4_ = (uint)*(byte *)((long)pvVar1 + 0x15);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"0U",
                 "(((bdb)[KHR_DF_WORD_BYTESPLANE1] >> (KHR_DF_SHIFT_BYTESPLANE1)) & (KHR_DF_MASK_BYTESPLANE1))"
                 ,(uint *)&gtest_ar_,(uint *)&local_90);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar5 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar5 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
                   ,0x2ff,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
        goto LAB_00122b77;
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar_.success_ = false;
    gtest_ar_._1_3_ = 0;
    local_90.data_._0_4_ = (uint)*(byte *)((long)pvVar1 + 0x16);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"0U",
               "(((bdb)[KHR_DF_WORD_BYTESPLANE2] >> (KHR_DF_SHIFT_BYTESPLANE2)) & (KHR_DF_MASK_BYTESPLANE2))"
               ,(uint *)&gtest_ar_,(uint *)&local_90);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
                 ,0x300,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar_.success_ = false;
    gtest_ar_._1_3_ = 0;
    local_90.data_._0_4_ = (uint)*(byte *)((long)pvVar1 + 0x17);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"0U",
               "(((bdb)[KHR_DF_WORD_BYTESPLANE3] >> (KHR_DF_SHIFT_BYTESPLANE3)) & (KHR_DF_MASK_BYTESPLANE3))"
               ,(uint *)&gtest_ar_,(uint *)&local_90);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
                 ,0x301,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar_.success_ = false;
    gtest_ar_._1_3_ = 0;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"0U","bdb[KHR_DF_WORD_BYTESPLANE4]",(uint *)&gtest_ar_,local_40
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
                 ,0x302,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    operator_delete__(pvVar1);
    lVar6 = local_48 + 1;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

TEST_F(DFDVkFormatListTest, ReconstructDFDBytesPlanes) {

    uint32_t* dfd;
    uint32_t* bdb;
    uint32_t origBytesPlane03, origBytesPlane47;

    for (uint32_t i = 0; i < sizeof(formats) / sizeof(VkFormat); i++) {
        dfd = vk2dfd(formats[i]);
        ASSERT_TRUE(dfd != NULL) << "vk2dfd failed to produce DFD for "
                                 << vkFormatString(formats[i]);
        bdb = dfd + 1;
        // There are 4 bytesPlane values in one word. Capture all at once.
        origBytesPlane03 = bdb[KHR_DF_WORD_BYTESPLANE0];
        origBytesPlane47 = bdb[KHR_DF_WORD_BYTESPLANE4];
        bdb[KHR_DF_WORD_BYTESPLANE0] = 0U;
        bdb[KHR_DF_WORD_BYTESPLANE1] = 0U;
        reconstructDFDBytesPlanesFromSamples(dfd);
        EXPECT_EQ(origBytesPlane03, bdb[KHR_DF_WORD_BYTESPLANE0]);
        EXPECT_EQ(origBytesPlane47, bdb[KHR_DF_WORD_BYTESPLANE4]);
        free(dfd);
    }

    // No need to test reconstruction for UASTC as, colorModel aside, the DFD
    // is identical to that for VK_FORMAT_ASTC_4x4_BLOCK_UNORM which has been
    // tested above.

    // Make ETC1S DFDs and test reconstruction.
    for (uint32_t sampleCount = 1; sampleCount < 3; sampleCount++) {
        uint32_t bdbSize = KHR_DF_WORD_SAMPLESTART
                           + sampleCount * KHR_DF_WORD_SAMPLEWORDS;
        bdbSize *= sizeof(uint32_t);
        uint32_t dfdSize = bdbSize + 1 * sizeof(uint32_t);
        dfd = new uint32_t[dfdSize];
        bdb = dfd + 1;

        KHR_DFDSETVAL(bdb, VENDORID, KHR_DF_VENDORID_KHRONOS);
        KHR_DFDSETVAL(bdb, DESCRIPTORTYPE, KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT);
        KHR_DFDSETVAL(bdb, VERSIONNUMBER, KHR_DF_VERSIONNUMBER_LATEST);
        KHR_DFDSETVAL(bdb, DESCRIPTORBLOCKSIZE, bdbSize);
        KHR_DFDSETVAL(bdb, MODEL, KHR_DF_MODEL_ETC1S);
        KHR_DFDSETVAL(bdb, PRIMARIES, KHR_DF_PRIMARIES_BT709);
        KHR_DFDSETVAL(bdb, TRANSFER, KHR_DF_TRANSFER_SRGB);
        KHR_DFDSETVAL(bdb, FLAGS, 0);

        bdb[KHR_DF_WORD_TEXELBLOCKDIMENSION0] =
                                3 | (3 << KHR_DF_SHIFT_TEXELBLOCKDIMENSION1);
        bdb[KHR_DF_WORD_BYTESPLANE0] = 0; /* bytesPlane3..0 = 0 */
        //KHR_DFDSETVAL(nbdb, BYTESPLANE0, 8);
        //if (sampleCoount == 2)
        //    KHR_DFDSETVAL(nbdb, BYTESPLANE1, 8);
        bdb[KHR_DF_WORD_BYTESPLANE4] = 0; /* bytesPlane7..5 = 0 */

        for (uint32_t sample = 0; sample < sampleCount; sample++) {
            uint16_t channelId, bitOffset;
            if (sample == 0) {
                bitOffset = 0;
                channelId = KHR_DF_CHANNEL_ETC1S_RGB;
            } else {
                bitOffset = 64;
                channelId = KHR_DF_CHANNEL_ETC1S_AAA;
            }
            KHR_DFDSETSVAL(bdb, sample, CHANNELID, channelId);
            KHR_DFDSETSVAL(bdb, sample, QUALIFIERS, 0);
            KHR_DFDSETSVAL(bdb, sample, SAMPLEPOSITION_ALL, 0);
            KHR_DFDSETSVAL(bdb, sample, BITOFFSET, bitOffset);
            KHR_DFDSETSVAL(bdb, sample, BITLENGTH, 63);
            KHR_DFDSETSVAL(bdb, sample, SAMPLELOWER, 0);
            KHR_DFDSETSVAL(bdb, sample, SAMPLEUPPER, UINT32_MAX);
        }
        reconstructDFDBytesPlanesFromSamples(dfd);
        EXPECT_EQ(8U, KHR_DFDVAL(bdb, BYTESPLANE0));
        if (sampleCount == 2)
            EXPECT_EQ(8U, KHR_DFDVAL(bdb, BYTESPLANE1));
        else
            EXPECT_EQ(0U, KHR_DFDVAL(bdb, BYTESPLANE1));
        EXPECT_EQ(0U, KHR_DFDVAL(bdb, BYTESPLANE2));
        EXPECT_EQ(0U, KHR_DFDVAL(bdb, BYTESPLANE3));
        EXPECT_EQ(0U, bdb[KHR_DF_WORD_BYTESPLANE4]);

        delete[] dfd;
    }
}